

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O1

MIR_reg_t scan_var_to_var(gen_ctx_t gen_ctx,int scan_var)

{
  void **ppvVar1;
  gen_ctx_t bm;
  VARR_live_range_t *pVVar2;
  bitmap_t pVVar3;
  lr_bb_t_conflict *pplVar4;
  live_range_t_conflict plVar5;
  live_range_t_conflict plVar6;
  live_range_t plVar7;
  int extraout_EDX;
  uint extraout_EDX_00;
  uint start;
  uint uVar8;
  ulong uVar9;
  size_t nb;
  gen_ctx_t gen_ctx_00;
  int in_R8D;
  ulong uVar10;
  
  uVar9 = (ulong)(uint)scan_var;
  if (gen_ctx->lr_ctx->scan_vars_num == 0) {
    return scan_var;
  }
  if (scan_var < 0) {
LAB_0016fd6b:
    __assert_fail("scan_var >= 0 && (int) (VARR_MIR_reg_tlength (gen_ctx->lr_ctx->scan_var_to_var_map)) > scan_var"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x171b,"MIR_reg_t scan_var_to_var(gen_ctx_t, int)");
  }
  plVar7 = (live_range_t)gen_ctx->lr_ctx->scan_var_to_var_map;
  if (plVar7 == (live_range_t)0x0) {
    scan_var_to_var_cold_2();
  }
  else {
    pplVar4 = &plVar7->lr_bb;
    if ((int)*pplVar4 <= scan_var) goto LAB_0016fd6b;
    plVar7 = *(live_range_t *)&plVar7->ref_cost;
    if ((plVar7 != (live_range_t)0x0) && ((lr_bb_t_conflict)(ulong)(uint)scan_var < *pplVar4)) {
      return *(MIR_reg_t *)((long)&plVar7->lr_bb + (long)(ulong)(uint)scan_var * 4);
    }
  }
  scan_var_to_var_cold_1();
  uVar8 = (uint)uVar9;
  start = (uint)plVar7;
  uVar10 = uVar9 & 0xffffffff;
  gen_ctx_00 = gen_ctx;
  if ((in_R8D != 0) && (gen_ctx->lr_ctx->scan_vars_num == 0)) {
    bm = (gen_ctx_t)gen_ctx->lr_ctx->referenced_vars;
    nb = uVar10 + 1;
    gen_ctx_00 = bm;
    bitmap_expand((bitmap_t)bm,nb);
    uVar8 = (uint)nb;
    if (bm == (gen_ctx_t)0x0) goto LAB_0016fe7f;
    plVar7 = (live_range_t)(uVar10 >> 6);
    ppvVar1 = &bm->curr_func_item->data + (long)plVar7;
    *ppvVar1 = (void *)((ulong)*ppvVar1 | 1L << (uVar9 & 0x3f));
  }
  pVVar2 = gen_ctx->lr_ctx->var_live_ranges;
  if (((pVVar2 == (VARR_live_range_t *)0x0) ||
      (plVar7 = (live_range_t)pVVar2->varr, plVar7 == (live_range_t)0x0)) ||
     (pVVar2->els_num <= uVar10)) {
    make_var_dead_cold_4();
LAB_0016fe75:
    make_var_dead_cold_2();
  }
  else {
    pVVar3 = gen_ctx->lr_ctx->live_vars;
    if (pVVar3 != (bitmap_t)0x0) {
      plVar6 = (live_range_t_conflict)(&plVar7->lr_bb)[uVar10];
      plVar5 = (live_range_t_conflict)(long)extraout_EDX;
      if ((plVar5 < (live_range_t_conflict)(pVVar3->els_num << 6)) &&
         (uVar9 = pVVar3->varr[(ulong)plVar5 >> 6],
         pVVar3->varr[(ulong)plVar5 >> 6] = uVar9 & ~(1L << ((ulong)plVar5 & 0x3f)),
         (uVar9 >> ((ulong)plVar5 & 0x3f) & 1) != 0)) {
        plVar6->finish = start;
LAB_0016fe67:
        return (MIR_reg_t)plVar5;
      }
      uVar8 = start;
      plVar5 = create_live_range(gen_ctx,start,start,plVar6);
      plVar7 = (live_range_t)pVVar2->varr;
      gen_ctx_00 = gen_ctx;
      if ((plVar7 != (live_range_t)0x0) && (uVar10 < pVVar2->els_num)) {
        (&plVar7->lr_bb)[uVar10] = (lr_bb_t_conflict)plVar5;
        goto LAB_0016fe67;
      }
      goto LAB_0016fe75;
    }
  }
  make_var_dead_cold_3();
LAB_0016fe7f:
  make_var_dead_cold_1();
  plVar6 = gen_ctx_00->lr_ctx->free_lr_list;
  if (plVar6 == (live_range_t_conflict)0x0) {
    plVar6 = (live_range_t_conflict)malloc(0x20);
    if (plVar6 == (live_range_t_conflict)0x0) {
      util_error(gen_ctx_00,"no memory");
    }
  }
  else {
    gen_ctx_00->lr_ctx->free_lr_list = plVar6->next;
  }
  if ((int)uVar8 < 0) {
    __assert_fail("start >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x186d,"live_range_t create_live_range(gen_ctx_t, int, int, live_range_t)");
  }
  if (extraout_EDX_00 < uVar8) {
    __assert_fail("finish < 0 || start <= finish",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                  ,0x186e,"live_range_t create_live_range(gen_ctx_t, int, int, live_range_t)");
  }
  plVar6->start = uVar8;
  plVar6->finish = extraout_EDX_00;
  plVar6->ref_cost = 1;
  plVar6->next = plVar7;
  plVar6->lr_bb = (lr_bb_t_conflict)0x0;
  return (MIR_reg_t)plVar6;
}

Assistant:

static MIR_reg_t scan_var_to_var (gen_ctx_t gen_ctx, int scan_var) {
  if (scan_vars_num == 0) return (MIR_reg_t) scan_var;
  gen_assert (scan_var >= 0 && (int) VARR_LENGTH (MIR_reg_t, scan_var_to_var_map) > scan_var);
  return VARR_GET (MIR_reg_t, scan_var_to_var_map, scan_var);
}